

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

bool __thiscall CConnman::InactivityCheck(CConnman *this,CNode *node)

{
  long lVar1;
  long lVar2;
  long lVar3;
  string_view source_file;
  char cVar4;
  bool bVar5;
  time_point tVar6;
  Logger *pLVar7;
  bool bVar8;
  int iVar9;
  char *pcVar10;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file_00;
  string_view source_file_01;
  string_view str;
  string_view logging_function_01;
  long *in_stack_fffffffffffffef8;
  long *in_stack_ffffffffffffff00;
  bool local_f2;
  undefined1 local_f1;
  rep local_f0 [2];
  string log_msg;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  tVar6 = NodeClock::now();
  lVar3 = (long)tVar6.__d.__r / 1000000000;
  lVar1 = (node->m_last_send)._M_i.__r;
  lVar2 = (node->m_last_recv)._M_i.__r;
  if ((this->m_peer_connect_timeout).__r + (node->m_connected).__r < lVar3) {
    if (lVar1 == 0 || lVar2 == 0) {
      pLVar7 = LogInstance();
      bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar7,NET,Debug);
      bVar8 = true;
      if (bVar5) {
        local_f0[0] = (this->m_peer_connect_timeout).__r;
        local_f1 = lVar2 != 0;
        local_f2 = lVar1 != 0;
        pLVar7 = LogInstance();
        bVar5 = BCLog::Logger::Enabled(pLVar7);
        if (bVar5) {
          log_msg._M_string_length = 0;
          log_msg.field_2._M_local_buf[0] = '\0';
          log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
          tinyformat::format<long,bool,bool,long>
                    (&local_58,
                     (tinyformat *)"socket no message in first %i seconds, %d %d peer=%d\n",
                     (char *)local_f0,(long *)&local_f1,&local_f2,(bool *)&stack0xffffffffffffff00,
                     in_stack_fffffffffffffef8);
          InactivityCheck();
          pLVar7 = LogInstance();
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
          source_file._M_len = 0x50;
          str._M_str = log_msg._M_dataplus._M_p;
          str._M_len = log_msg._M_string_length;
          logging_function_01._M_str = "InactivityCheck";
          logging_function_01._M_len = 0xf;
          BCLog::Logger::LogPrintStr(pLVar7,str,logging_function_01,source_file,0x7b1,NET,Debug);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)log_msg._M_dataplus._M_p != &log_msg.field_2) {
            operator_delete(log_msg._M_dataplus._M_p,
                            CONCAT71(log_msg.field_2._M_allocated_capacity._1_7_,
                                     log_msg.field_2._M_local_buf[0]) + 1);
          }
        }
      }
      goto LAB_001a7706;
    }
    if (lVar1 + 0x4b0 < lVar3) {
      pLVar7 = LogInstance();
      bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar7,NET,Debug);
      bVar8 = true;
      if (!bVar5) goto LAB_001a7706;
      local_58._M_dataplus._M_p = (pointer)node->id;
      pcVar10 = "socket sending timeout: %is peer=%d\n";
      iVar9 = 0x7b6;
      lVar2 = lVar1;
    }
    else {
      if (lVar3 <= lVar2 + 0x4b0) {
        if (((node->fSuccessfullyConnected)._M_base._M_i & 1U) == 0) {
          (*((node->m_transport)._M_t.
             super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
             super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
             super__Head_base<0UL,_Transport_*,_false>._M_head_impl)->_vptr_Transport[2])(&log_msg);
          cVar4 = (char)log_msg._M_dataplus._M_p;
          pLVar7 = LogInstance();
          bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar7,NET,Debug);
          if (cVar4 == '\0') {
            bVar8 = true;
            if (!bVar5) goto LAB_001a7706;
            log_msg._M_dataplus._M_p = (pointer)node->id;
            pcVar10 = "V2 handshake timeout peer=%d\n";
            iVar9 = 0x7c1;
          }
          else {
            bVar8 = true;
            if (!bVar5) goto LAB_001a7706;
            log_msg._M_dataplus._M_p = (pointer)node->id;
            pcVar10 = "version handshake timeout peer=%d\n";
            iVar9 = 0x7c3;
          }
          bVar8 = true;
          logging_function_00._M_str = "InactivityCheck";
          logging_function_00._M_len = 0xf;
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
          source_file_01._M_len = 0x50;
          LogPrintf_<long>(logging_function_00,source_file_01,iVar9,NET,Debug,pcVar10,
                           (long *)&log_msg);
          goto LAB_001a7706;
        }
        goto LAB_001a7704;
      }
      pLVar7 = LogInstance();
      bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar7,NET,Debug);
      bVar8 = true;
      if (!bVar5) goto LAB_001a7706;
      local_58._M_dataplus._M_p = (pointer)node->id;
      pcVar10 = "socket receive timeout: %is peer=%d\n";
      iVar9 = 0x7bb;
    }
    log_msg._M_dataplus._M_p = (pointer)(lVar3 - lVar2);
    bVar8 = true;
    logging_function._M_str = "InactivityCheck";
    logging_function._M_len = 0xf;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
    source_file_00._M_len = 0x50;
    LogPrintf_<long,long>
              (logging_function,source_file_00,iVar9,(LogFlags)pcVar10,(Level)&log_msg,
               (char *)&local_58,in_stack_fffffffffffffef8,in_stack_ffffffffffffff00);
  }
  else {
LAB_001a7704:
    bVar8 = false;
  }
LAB_001a7706:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::InactivityCheck(const CNode& node) const
{
    // Tests that see disconnects after using mocktime can start nodes with a
    // large timeout. For example, -peertimeout=999999999.
    const auto now{GetTime<std::chrono::seconds>()};
    const auto last_send{node.m_last_send.load()};
    const auto last_recv{node.m_last_recv.load()};

    if (!ShouldRunInactivityChecks(node, now)) return false;

    if (last_recv.count() == 0 || last_send.count() == 0) {
        LogDebug(BCLog::NET, "socket no message in first %i seconds, %d %d peer=%d\n", count_seconds(m_peer_connect_timeout), last_recv.count() != 0, last_send.count() != 0, node.GetId());
        return true;
    }

    if (now > last_send + TIMEOUT_INTERVAL) {
        LogDebug(BCLog::NET, "socket sending timeout: %is peer=%d\n", count_seconds(now - last_send), node.GetId());
        return true;
    }

    if (now > last_recv + TIMEOUT_INTERVAL) {
        LogDebug(BCLog::NET, "socket receive timeout: %is peer=%d\n", count_seconds(now - last_recv), node.GetId());
        return true;
    }

    if (!node.fSuccessfullyConnected) {
        if (node.m_transport->GetInfo().transport_type == TransportProtocolType::DETECTING) {
            LogDebug(BCLog::NET, "V2 handshake timeout peer=%d\n", node.GetId());
        } else {
            LogDebug(BCLog::NET, "version handshake timeout peer=%d\n", node.GetId());
        }
        return true;
    }

    return false;
}